

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O1

void cmLoadedCommand::InstallSignalHandlers(char *name,int remove)

{
  LastName = "????";
  if (name != (char *)0x0) {
    LastName = name;
  }
  if (remove != 0) {
    signal(0xb,(__sighandler_t)0x0);
    signal(7,(__sighandler_t)0x0);
    signal(4,(__sighandler_t)0x0);
    return;
  }
  signal(0xb,TrapsForSignalsCFunction);
  signal(7,TrapsForSignalsCFunction);
  signal(4,TrapsForSignalsCFunction);
  return;
}

Assistant:

static void InstallSignalHandlers(const char* name, int remove = 0)
  {
    cmLoadedCommand::LastName = name;
    if (!name) {
      cmLoadedCommand::LastName = "????";
    }

    if (!remove) {
      signal(SIGSEGV, TrapsForSignalsCFunction);
#ifdef SIGBUS
      signal(SIGBUS, TrapsForSignalsCFunction);
#endif
      signal(SIGILL, TrapsForSignalsCFunction);
    } else {
      signal(SIGSEGV, CM_NULLPTR);
#ifdef SIGBUS
      signal(SIGBUS, CM_NULLPTR);
#endif
      signal(SIGILL, CM_NULLPTR);
    }
  }